

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O1

int test_json2map_prefix(void)

{
  int iVar1;
  char *__s2;
  json2map_t *obj;
  int iVar2;
  
  __s2 = (char *)calloc(0x1fe,0xff);
  obj = json2map_init('\0');
  json2map_registerDataHook(obj,__s2,json2map_hookMethod);
  json2map_parse(obj,"prefix",
                 "{\"lvl1\":{\"lvl2\":{\"lvl3\":{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}]}}}]}}}}}"
                );
  printf("Expected: \t%s\nActual: \t%s\n\n",
         "prefix.lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[0].lvl9",__s2);
  iVar1 = strcmp("prefix.lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[0].lvl9",__s2);
  iVar2 = 1;
  if (iVar1 == 0) {
    printf("Expected: \t%s\nActual: \t%s\n\n","123456789",__s2 + 0xff);
    iVar1 = strcmp("123456789",__s2 + 0xff);
    if (iVar1 == 0) {
      printf("Expected: \t%s\nActual: \t%s\n\n",
             "prefix.lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[x]",__s2 + 0x1fe);
      iVar1 = strcmp("prefix.lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[x]",__s2 + 0x1fe);
      if (iVar1 == 0) {
        printf("Expected: \t%s\nActual: \t%s\n\n","1",__s2 + 0x2fd);
        iVar1 = strcmp("1",__s2 + 0x2fd);
        if (iVar1 == 0) {
          printf("Expected: \t%s\nActual: \t%s\n\n","prefix.lvl1.lvl2.lvl3.lvl4.lvl5[x]",
                 __s2 + 0x3fc);
          iVar1 = strcmp("prefix.lvl1.lvl2.lvl3.lvl4.lvl5[x]",__s2 + 0x3fc);
          if (iVar1 == 0) {
            printf("Expected: \t%s\nActual: \t%s\n\n","1",__s2 + 0x4fb);
            iVar1 = strcmp("1",__s2 + 0x4fb);
            if (iVar1 == 0) {
              json2map_destroy(obj);
              free(__s2);
              iVar2 = 0;
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int test_json2map_prefix() {
	keyvalue_t *map = (keyvalue_t *) calloc(sizeof(keyvalue_t), LIST_SIZE);

	json2map_t *json2mapObj = json2map_init(0);
	json2map_registerDataHook(json2mapObj, map, &json2map_hookMethod);
	json2map_parse(json2mapObj, "prefix", "{\"lvl1\":{\"lvl2\":{\"lvl3\":{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}]}}}]}}}}}");

	ASSERTSTR("prefix.lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[0].lvl9", map[0].key);
	ASSERTSTR("123456789", map[0].value);

	ASSERTSTR("prefix.lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[x]", map[1].key);
	ASSERTSTR("1", map[1].value);

	ASSERTSTR("prefix.lvl1.lvl2.lvl3.lvl4.lvl5[x]", map[2].key);
	ASSERTSTR("1", map[2].value);

	json2map_destroy(json2mapObj);
	free(map);
	return 0;
}